

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::~IfcSlab(IfcSlab *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x99eea8;
  *(undefined8 *)&this->field_0x180 = 0x99efc0;
  *(undefined8 *)&this->field_0x88 = 0x99eed0;
  *(undefined8 *)&this->field_0x98 = 0x99eef8;
  *(undefined8 *)&this->field_0xd0 = 0x99ef20;
  *(undefined8 *)&this->field_0x100 = 0x99ef48;
  *(undefined8 *)&this->field_0x138 = 0x99ef70;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x99ef98;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__0099efe0);
  operator_delete(this,0x198);
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}